

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::cliquePartition
          (HighsCliqueTable *this,vector<double,_std::allocator<double>_> *objective,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clqVars
          ,vector<int,_std::allocator<int>_> *partitionStart)

{
  anon_class_8_1_bccf3fd9 comp;
  anon_class_8_1_bccf3fd9 comp_00;
  bool bVar1;
  CliqueVar *this_00;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  CliqueVar *in_RCX;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *in_RDX;
  undefined8 in_RSI;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_RDI;
  HighsInt extensionStart;
  CliqueVar v;
  HighsInt i;
  HighsInt lastSwappedIndex;
  HighsInt extensionEnd;
  HighsInt numClqVars;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
  *in_stack_ffffffffffffff08;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  CliqueVar *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  HighsInt in_stack_ffffffffffffff24;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  end;
  HighsCliqueTable *this_01;
  int local_b0;
  value_type local_ac;
  int local_a8;
  value_type local_a4;
  undefined8 local_a0;
  CliqueVar *local_98;
  CliqueVar *local_90;
  CliqueVar *local_88;
  CliqueVar *local_80;
  CliqueVar *local_78;
  int local_70;
  int local_6c [3];
  int local_60;
  undefined8 local_38;
  CliqueVar *local_30;
  CliqueVar *local_28;
  CliqueVar *local_20;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *local_18;
  undefined8 local_10;
  
  this_01 = (HighsCliqueTable *)(in_RDI._M_current + 0x70);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  this_00 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)0x53641c);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
            (local_18);
  HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
            ((HighsRandom *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,(HighsInt)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  local_28 = (CliqueVar *)
             std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::begin(in_stack_ffffffffffffff08);
  local_30 = (CliqueVar *)
             std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::end(in_stack_ffffffffffffff08);
  local_38 = local_10;
  comp.objective._4_4_ = in_stack_ffffffffffffff24;
  comp.objective._0_4_ = in_stack_ffffffffffffff20;
  pdqsort_branchless<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>
            (in_RDI,in_stack_ffffffffffffff28,comp);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5364a8);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
            (local_18);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)this_01);
  sVar2 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          size(local_18);
  local_60 = (int)sVar2;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x5364e5);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
            (local_18);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)this_01);
  local_6c[2] = local_60;
  local_6c[1] = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff10,(value_type_conflict2 *)in_stack_ffffffffffffff08);
  local_6c[0] = 0;
  end._M_current = local_20;
  for (local_70 = 0; local_70 < local_60; local_70 = local_70 + 1) {
    if (local_70 == local_6c[2]) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (value_type_conflict2 *)in_stack_ffffffffffffff18);
      local_6c[2] = local_60;
      if (local_70 <= local_6c[0]) {
        local_80 = (CliqueVar *)
                   std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::begin(in_stack_ffffffffffffff08);
        local_78 = (CliqueVar *)
                   __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                *)in_stack_ffffffffffffff18,
                               (difference_type)in_stack_ffffffffffffff10);
        local_98 = (CliqueVar *)
                   std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::begin(in_stack_ffffffffffffff08);
        local_90 = (CliqueVar *)
                   __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                *)in_stack_ffffffffffffff18,
                               (difference_type)in_stack_ffffffffffffff10);
        local_88 = (CliqueVar *)
                   __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                *)in_stack_ffffffffffffff18,
                               (difference_type)in_stack_ffffffffffffff10);
        local_a0 = local_10;
        comp_00.objective._4_4_ = in_stack_ffffffffffffff24;
        comp_00.objective._0_4_ = in_stack_ffffffffffffff20;
        pdqsort_branchless<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__1>
                  (in_RDI,end,comp_00);
      }
      local_6c[0] = 0;
    }
    pvVar3 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::operator[](local_18,(long)local_70);
    local_ac = *pvVar3;
    local_a8 = local_70 + 1;
    in_stack_ffffffffffffff18 = in_RDI._M_current + 0x78;
    local_a4 = local_ac;
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::data
              ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x5366c7);
    in_stack_ffffffffffffff24 =
         partitionNeighbourhood
                   (this_01,(vector<int,_std::allocator<int>_> *)in_RDI._M_current,
                    (int64_t *)end._M_current,SUB84((ulong)this_00 >> 0x20,0),
                    (CliqueVar *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    local_6c[2] = in_stack_ffffffffffffff24 + local_a8;
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (!bVar1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::back(in_stack_ffffffffffffff10);
      local_b0 = *pvVar4 + local_a8;
      in_stack_ffffffffffffff10 =
           (vector<int,_std::allocator<int>_> *)std::max<int>(&local_b0,local_6c);
      local_6c[0] = *(int *)&(in_stack_ffffffffffffff10->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start;
    }
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (value_type_conflict2 *)in_stack_ffffffffffffff18);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  return;
}

Assistant:

void HighsCliqueTable::cliquePartition(const std::vector<double>& objective,
                                       std::vector<CliqueVar>& clqVars,
                                       std::vector<HighsInt>& partitionStart) {
  randgen.shuffle(clqVars.data(), clqVars.size());

  pdqsort_branchless(clqVars.begin(), clqVars.end(),
                     [&](CliqueVar v1, CliqueVar v2) {
                       return (2 * v1.val - 1) * objective[v1.col] >
                              (2 * v2.val - 1) * objective[v2.col];
                     });

  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(clqVars.size());

  HighsInt numClqVars = clqVars.size();
  partitionStart.clear();
  partitionStart.reserve(clqVars.size());
  HighsInt extensionEnd = numClqVars;
  partitionStart.push_back(0);
  HighsInt lastSwappedIndex = 0;
  for (HighsInt i = 0; i < numClqVars; ++i) {
    if (i == extensionEnd) {
      partitionStart.push_back(i);
      extensionEnd = numClqVars;
      if (lastSwappedIndex >= i)
        pdqsort_branchless(clqVars.begin() + i,
                           clqVars.begin() + lastSwappedIndex + 1,
                           [&](CliqueVar v1, CliqueVar v2) {
                             return (2 * v1.val - 1) * objective[v1.col] >
                                    (2 * v2.val - 1) * objective[v2.col];
                           });
      lastSwappedIndex = 0;
    }
    CliqueVar v = clqVars[i];
    HighsInt extensionStart = i + 1;
    extensionEnd =
        partitionNeighbourhood(neighbourhoodInds, numNeighbourhoodQueries, v,
                               clqVars.data() + extensionStart,
                               extensionEnd - extensionStart) +
        extensionStart;
    if (!neighbourhoodInds.empty())
      lastSwappedIndex =
          std::max(neighbourhoodInds.back() + extensionStart, lastSwappedIndex);
  }

  partitionStart.push_back(numClqVars);
}